

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PClass::ReadValue(PClass *this,FArchive *ar,void *addr)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  PClass *local_40;
  PClass *parent;
  PClass *type;
  bool readsomething;
  void *pvStack_28;
  BYTE tag;
  void *addr_local;
  FArchive *ar_local;
  PClass *this_local;
  
  pvStack_28 = addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,(BYTE *)((long)&type + 7));
  if (type._7_1_ == 0x12) {
    type._6_1_ = 0;
    FArchive::UserReadClass((FArchive *)addr_local,&parent);
    while (local_40 = this, parent != (PClass *)0x0) {
      for (; (local_40 != (PClass *)0x0 && (local_40 != parent)); local_40 = local_40->ParentClass)
      {
      }
      if (local_40 == (PClass *)0x0) {
        pcVar2 = FName::GetChars(&(parent->super_PStruct).super_PNamedType.TypeName);
        pcVar3 = FName::GetChars(&(this->super_PStruct).super_PNamedType.TypeName);
        DPrintf(1,"Unknown superclass %s of class %s\n",pcVar2,pcVar3);
        PType::SkipValue((FArchive *)addr_local,0xe);
      }
      else {
        bVar1 = PStruct::ReadFields(&parent->super_PStruct,(FArchive *)addr_local,pvStack_28);
        type._6_1_ = (type._6_1_ & 1) != 0 || bVar1;
      }
      FArchive::UserReadClass((FArchive *)addr_local,&parent);
    }
    this_local._7_1_ = (bool)(type._6_1_ & 1);
  }
  else {
    PType::SkipValue((FArchive *)addr_local,(uint)type._7_1_);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PClass::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag != VAL_Class)
	{
		SkipValue(ar, tag);
		return false;
	}
	else
	{
		bool readsomething = false;
		PClass *type;
		for (ar.UserReadClass(type); type != NULL; ar.UserReadClass(type))
		{
			// Only read it if the type is related to this one.
			const PClass *parent;
			for (parent = this; parent != NULL; parent = parent->ParentClass)
			{
				if (parent == type)
				{
					break;
				}
			}
			if (parent != NULL)
			{
				readsomething |= type->ReadFields(ar, addr);
			}
			else
			{
				DPrintf(DMSG_ERROR, "Unknown superclass %s of class %s\n",
					type->TypeName.GetChars(), TypeName.GetChars());
				SkipValue(ar, VAL_Struct);
			}
		}
		return readsomething;
	}
}